

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

_Bool mi_manage_os_memory_ex2
                (void *start,size_t size,_Bool is_large,int numa_node,_Bool exclusive,
                mi_memid_t memid,mi_arena_id_t *arena_id)

{
  _Bool _Var1;
  mi_arena_id_t mVar2;
  int iVar3;
  ulong size_00;
  uintptr_t count;
  mi_bitmap_index_t bitmap_idx;
  _Bool *any_zero;
  mi_arena_id_t *pmVar4;
  mi_arena_id_t in_ECX;
  byte in_DL;
  mi_bitmap_t in_RSI;
  void *in_RDI;
  byte in_R8B;
  mi_arena_id_t *in_R9;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  mi_bitmap_index_t postidx;
  ptrdiff_t post;
  mi_arena_t *arena;
  mi_memid_t meta_memid;
  size_t asize;
  size_t bitmaps;
  size_t fields;
  size_t bcount;
  size_t diff;
  void *aligned_start;
  size_t in_stack_ffffffffffffff58;
  mi_arena_id_t *bitidx;
  void *in_stack_ffffffffffffff60;
  mi_arena_id_t *idx;
  mi_memid_t *in_stack_ffffffffffffff80;
  mi_stats_t *in_stack_ffffffffffffff88;
  mi_arena_id_t *in_stack_ffffffffffffff90;
  mi_arena_t *in_stack_ffffffffffffff98;
  mi_bitmap_t in_stack_ffffffffffffffc0;
  mi_bitmap_t local_18;
  void *local_10;
  _Bool local_1;
  
  if (in_R9 != (mi_arena_id_t *)0x0) {
    mVar2 = _mi_arena_id_none();
    *in_R9 = mVar2;
  }
  if (in_RSI < (mi_bitmap_t)0x2000000) {
    _mi_warning_message("the arena size is too small (memory at %p with size %zu)\n",in_RDI,in_RSI);
    local_1 = false;
  }
  else {
    _Var1 = _mi_is_aligned(in_RDI,0x2000000);
    local_18 = in_RSI;
    local_10 = in_RDI;
    if (!_Var1) {
      local_10 = mi_align_up_ptr(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      in_stack_ffffffffffffffc0 = (mi_bitmap_t)((long)local_10 - (long)in_RDI);
      if ((in_RSI <= in_stack_ffffffffffffffc0) ||
         ((ulong)((long)in_RSI - (long)in_stack_ffffffffffffffc0) < 0x2000000)) {
        _mi_warning_message("after alignment, the size of the arena becomes too small (memory at %p with size %zu)\n"
                            ,in_RDI,in_RSI);
        return false;
      }
      local_18 = (mi_bitmap_t)((long)in_RSI - (long)in_stack_ffffffffffffffc0);
    }
    size_00 = (ulong)local_18 >> 0x19;
    count = _mi_divide_up(size_00,0x40);
    iVar3 = 5;
    if (((byte)postidx & 1) != 0) {
      iVar3 = 3;
    }
    bitmap_idx = (mi_bitmap_index_t)iVar3;
    any_zero = (_Bool *)(bitmap_idx * count * 8 + 0xc0);
    pmVar4 = (mi_arena_id_t *)
             _mi_arena_meta_zalloc((size_t)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    if (pmVar4 == (mi_arena_id_t *)0x0) {
      local_1 = false;
    }
    else {
      mVar2 = _mi_arena_id_none();
      *pmVar4 = mVar2;
      *(ulong *)(pmVar4 + 6) = CONCAT71(postidx._1_7_,(byte)postidx);
      *(undefined8 *)(pmVar4 + 2) = in_stack_00000008;
      *(undefined8 *)(pmVar4 + 4) = in_stack_00000010;
      *(byte *)(pmVar4 + 0x17) = in_R8B & 1;
      *(_Bool **)(pmVar4 + 0xe) = any_zero;
      *(mi_arena_t **)(pmVar4 + 0x14) = in_stack_ffffffffffffff98;
      *(mi_stats_t **)(pmVar4 + 0x10) = in_stack_ffffffffffffff88;
      *(mi_arena_id_t **)(pmVar4 + 0x12) = in_stack_ffffffffffffff90;
      *(ulong *)(pmVar4 + 10) = size_00;
      *(uintptr_t *)(pmVar4 + 0xc) = count;
      LOCK();
      *(void **)(pmVar4 + 8) = local_10;
      UNLOCK();
      pmVar4[0x16] = in_ECX;
      *(byte *)((long)pmVar4 + 0x5d) = in_DL & 1;
      LOCK();
      pmVar4[0x24] = 0;
      pmVar4[0x25] = 0;
      UNLOCK();
      LOCK();
      pmVar4[0x22] = 0;
      pmVar4[0x23] = 0;
      UNLOCK();
      mi_lock_init((pthread_mutex_t *)0xad9ce9);
      *(mi_arena_id_t **)(pmVar4 + 0x26) = pmVar4 + count * 2 + 0x2e;
      *(mi_arena_id_t **)(pmVar4 + 0x2c) = pmVar4 + count * 4 + 0x2e;
      if ((*(byte *)(pmVar4 + 6) & 1) == 0) {
        idx = pmVar4 + count * 6 + 0x2e;
      }
      else {
        idx = (mi_arena_id_t *)0x0;
      }
      *(mi_arena_id_t **)(pmVar4 + 0x28) = idx;
      if ((*(byte *)(pmVar4 + 6) & 1) == 0) {
        bitidx = pmVar4 + count * 8 + 0x2e;
      }
      else {
        bitidx = (mi_arena_id_t *)0x0;
      }
      *(mi_arena_id_t **)(pmVar4 + 0x2a) = bitidx;
      if ((*(long *)(pmVar4 + 0x28) != 0) && ((*(byte *)((long)pmVar4 + 0x19) & 1) != 0)) {
        memset(*(void **)(pmVar4 + 0x28),0xff,count << 3);
      }
      if (0 < (long)(count * 0x40 - size_00)) {
        mi_bitmap_index_create((size_t)idx,(size_t)bitidx);
        _mi_bitmap_claim(in_stack_ffffffffffffffc0,size_00,count,bitmap_idx,any_zero);
      }
      local_1 = mi_arena_add(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                             in_stack_ffffffffffffff88);
    }
  }
  return local_1;
}

Assistant:

static bool mi_manage_os_memory_ex2(void* start, size_t size, bool is_large, int numa_node, bool exclusive, mi_memid_t memid, mi_arena_id_t* arena_id) mi_attr_noexcept
{
  if (arena_id != NULL) *arena_id = _mi_arena_id_none();
  if (size < MI_ARENA_BLOCK_SIZE) {
    _mi_warning_message("the arena size is too small (memory at %p with size %zu)\n", start, size);
    return false;
  }
  if (is_large) {
    mi_assert_internal(memid.initially_committed && memid.is_pinned);
  }
  if (!_mi_is_aligned(start, MI_SEGMENT_ALIGN)) {
    void* const aligned_start = mi_align_up_ptr(start, MI_SEGMENT_ALIGN);
    const size_t diff = (uint8_t*)aligned_start - (uint8_t*)start;
    if (diff >= size || (size - diff) < MI_ARENA_BLOCK_SIZE) {
      _mi_warning_message("after alignment, the size of the arena becomes too small (memory at %p with size %zu)\n", start, size);
      return false;
    }
    start = aligned_start;
    size = size - diff;
  }

  const size_t bcount = size / MI_ARENA_BLOCK_SIZE;
  const size_t fields = _mi_divide_up(bcount, MI_BITMAP_FIELD_BITS);
  const size_t bitmaps = (memid.is_pinned ? 3 : 5);
  const size_t asize  = sizeof(mi_arena_t) + (bitmaps*fields*sizeof(mi_bitmap_field_t));
  mi_memid_t meta_memid;
  mi_arena_t* arena   = (mi_arena_t*)_mi_arena_meta_zalloc(asize, &meta_memid);
  if (arena == NULL) return false;

  // already zero'd due to zalloc
  // _mi_memzero(arena, asize);
  arena->id = _mi_arena_id_none();
  arena->memid = memid;
  arena->exclusive = exclusive;
  arena->meta_size = asize;
  arena->meta_memid = meta_memid;
  arena->block_count = bcount;
  arena->field_count = fields;
  arena->start = (uint8_t*)start;
  arena->numa_node    = numa_node; // TODO: or get the current numa node if -1? (now it allows anyone to allocate on -1)
  arena->is_large     = is_large;
  arena->purge_expire = 0;
  arena->search_idx   = 0;
  mi_lock_init(&arena->abandoned_visit_lock);
  // consecutive bitmaps
  arena->blocks_dirty     = &arena->blocks_inuse[fields];     // just after inuse bitmap
  arena->blocks_abandoned = &arena->blocks_inuse[2 * fields]; // just after dirty bitmap
  arena->blocks_committed = (arena->memid.is_pinned ? NULL : &arena->blocks_inuse[3*fields]); // just after abandoned bitmap
  arena->blocks_purge     = (arena->memid.is_pinned ? NULL : &arena->blocks_inuse[4*fields]); // just after committed bitmap
  // initialize committed bitmap?
  if (arena->blocks_committed != NULL && arena->memid.initially_committed) {
    memset((void*)arena->blocks_committed, 0xFF, fields*sizeof(mi_bitmap_field_t)); // cast to void* to avoid atomic warning
  }

  // and claim leftover blocks if needed (so we never allocate there)
  ptrdiff_t post = (fields * MI_BITMAP_FIELD_BITS) - bcount;
  mi_assert_internal(post >= 0);
  if (post > 0) {
    // don't use leftover bits at the end
    mi_bitmap_index_t postidx = mi_bitmap_index_create(fields - 1, MI_BITMAP_FIELD_BITS - post);
    _mi_bitmap_claim(arena->blocks_inuse, fields, post, postidx, NULL);
  }
  return mi_arena_add(arena, arena_id, &_mi_stats_main);

}